

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.h
# Opt level: O2

Hammersley * __thiscall
pm::World::createSampler<pm::Hammersley,unsigned_int_const&>(World *this,uint *args)

{
  pointer *__ptr;
  _Head_base<0UL,_pm::Sampler_*,_false> local_28;
  _Head_base<0UL,_pm::Sampler_*,_false> local_20;
  
  std::make_unique<pm::Hammersley,unsigned_int_const&>((uint *)&local_20);
  local_28._M_head_impl = local_20._M_head_impl;
  local_20._M_head_impl = (Sampler *)0x0;
  std::
  vector<std::unique_ptr<pm::Sampler,std::default_delete<pm::Sampler>>,std::allocator<std::unique_ptr<pm::Sampler,std::default_delete<pm::Sampler>>>>
  ::emplace_back<std::unique_ptr<pm::Sampler,std::default_delete<pm::Sampler>>>
            ((vector<std::unique_ptr<pm::Sampler,std::default_delete<pm::Sampler>>,std::allocator<std::unique_ptr<pm::Sampler,std::default_delete<pm::Sampler>>>>
              *)&this->samplers_,
             (unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_> *)&local_28);
  if (local_28._M_head_impl != (Sampler *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Sampler[1])();
  }
  local_28._M_head_impl = (Sampler *)0x0;
  if (local_20._M_head_impl != (Sampler *)0x0) {
    (*(local_20._M_head_impl)->_vptr_Sampler[1])();
  }
  return (Hammersley *)
         (this->samplers_).
         super__Vector_base<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>,_std::allocator<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<pm::Sampler,_std::default_delete<pm::Sampler>_>._M_t.
         super__Tuple_impl<0UL,_pm::Sampler_*,_std::default_delete<pm::Sampler>_>.
         super__Head_base<0UL,_pm::Sampler_*,_false>._M_head_impl;
}

Assistant:

T *World::createSampler(Args &&... args)
{
	samplers_.push_back(std::make_unique<T>(std::forward<Args>(args)...));
	return static_cast<T *>(samplers_.back().get());
}